

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O3

ShaderPermutation vkt::SpirVAssembly::getShaderPermutation(deUint8 inputValue)

{
  return (ShaderPermutation)
         ((uint5)(inputValue >> 4 & 1) |
         (uint5)(inputValue >> 3 & 1) << 8 |
         (uint5)(inputValue >> 2 & 1) << 0x10 |
         (uint5)(inputValue >> 1 & 1) << 0x18 | (uint5)(inputValue & 1) << 0x20);
}

Assistant:

ShaderPermutation getShaderPermutation(deUint8 inputValue)
{
	ShaderPermutation	permutation =
	{
		static_cast<deUint8>(inputValue & 0x10? 1u: 0u),
		static_cast<deUint8>(inputValue & 0x08? 1u: 0u),
		static_cast<deUint8>(inputValue & 0x04? 1u: 0u),
		static_cast<deUint8>(inputValue & 0x02? 1u: 0u),
		static_cast<deUint8>(inputValue & 0x01? 1u: 0u)
	};
	return permutation;
}